

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O0

void __thiscall RSA::print_last_ciphertext_line(RSA *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_31;
  string local_30 [32];
  RSA *local_10;
  RSA *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Cipher Text",&local_31);
  Crypto::print_header(&this->super_Crypto,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  poVar2 = std::operator<<((ostream *)&std::cout,"Text: ");
  poVar2 = std::operator<<(poVar2,(string *)&(this->super_Crypto).cipherText);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = BigInt::isZero(&this->cipher_BigInt);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Num: ");
    poVar2 = operator<<(poVar2,&this->cipher_BigInt);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void RSA::print_last_ciphertext_line() {
    print_header("Cipher Text");
    cout << "Text: " << cipherText << endl;
    if (!cipher_BigInt.isZero())
        cout << "Num: " << cipher_BigInt << endl;

}